

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

void __thiscall
qclab::dense::SquareMatrix<double>::SquareMatrix
          (SquareMatrix<double> *this,double m00,double m01,double m10,double m11)

{
  double *pdVar1;
  
  this->size_ = 2;
  alloc_unique_array<double>((dense *)&this->data_,4);
  pdVar1 = (this->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  *pdVar1 = m00;
  pdVar1[1] = m10;
  pdVar1[2] = m01;
  pdVar1[3] = m11;
  return;
}

Assistant:

SquareMatrix( const T m00 , const T m01 ,
                      const T m10 , const T m11 )
        : size_( 2 )
        , data_( alloc_unique_array< T >( 4 ) )
        {
          data_[0] = m00 ; data_[1] = m10 ;
          data_[2] = m01 ; data_[3] = m11 ;
        }